

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_save_indentation(Parser *this,size_t behind)

{
  size_t *psVar1;
  State *pSVar2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  char msg [90];
  char local_78 [88];
  undefined2 local_20;
  
  if ((this->m_state->line_contents).rem.str < (this->m_state->line_contents).full.str) {
    pcVar9 = 
    "check failed: (m_state->line_contents.rem.begin() >= m_state->line_contents.full.begin())";
    pcVar10 = local_78;
    for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
      *(undefined8 *)pcVar10 = *(undefined8 *)pcVar9;
      pcVar9 = pcVar9 + 8;
      pcVar10 = pcVar10 + 8;
    }
    local_20 = 0x29;
    if ((s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x76c5) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x76c5) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_78,0x5a,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  pSVar2 = this->m_state;
  uVar8 = (long)(pSVar2->line_contents).rem.str - (long)(pSVar2->line_contents).full.str;
  pSVar2->indref = uVar8;
  if (uVar8 < behind) {
    builtin_strncpy(local_78 + 0x20,"->indref)",10);
    builtin_strncpy(local_78 + 0x10,"ehind <= m_state",0x10);
    builtin_strncpy(local_78,"check failed: (b",0x10);
    if ((s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x76c7) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x76c7) << 0x40,8);
    LVar5.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar5.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_78,0x2a,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  psVar1 = &this->m_state->indref;
  *psVar1 = *psVar1 - behind;
  return;
}

Assistant:

void Parser::_save_indentation(size_t behind)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->line_contents.rem.begin() >= m_state->line_contents.full.begin());
    m_state->indref = static_cast<size_t>(m_state->line_contents.rem.begin() - m_state->line_contents.full.begin());
    _RYML_CB_ASSERT(m_stack.m_callbacks, behind <= m_state->indref);
    m_state->indref -= behind;
    _c4dbgpf("state[{}]: saving indentation: {}", m_state-m_stack.begin(), m_state->indref);
}